

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_obj.c
# Opt level: O0

void do_zap(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  CHAR_DATA *ch_01;
  CHAR_DATA *in_RDI;
  OBJ_DATA *obj;
  OBJ_DATA *wand;
  CHAR_DATA *victim;
  char arg [4608];
  undefined4 in_stack_ffffffffffffedc8;
  int in_stack_ffffffffffffedcc;
  char *in_stack_ffffffffffffedd0;
  OBJ_DATA *argument_00;
  CHAR_DATA *in_stack_ffffffffffffedd8;
  char *in_stack_ffffffffffffede0;
  char local_1218;
  OBJ_DATA *in_stack_ffffffffffffedf0;
  OBJ_DATA *in_stack_ffffffffffffee18;
  CHAR_DATA *in_stack_ffffffffffffee20;
  CHAR_DATA *in_stack_ffffffffffffee28;
  int in_stack_ffffffffffffee30;
  int in_stack_ffffffffffffee34;
  int in_stack_ffffffffffffeea4;
  undefined1 in_stack_ffffffffffffeeab;
  int in_stack_ffffffffffffeeac;
  CHAR_DATA *in_stack_ffffffffffffeeb0;
  int in_stack_ffffffffffffeecc;
  CHAR_DATA *in_stack_ffffffffffffeed0;
  char *in_stack_ffffffffffffffd0;
  CHAR_DATA *in_stack_ffffffffffffffd8;
  
  one_argument(in_stack_ffffffffffffedd0,
               (char *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
  if ((local_1218 == '\0') && (in_RDI->fighting == (CHAR_DATA *)0x0)) {
    send_to_char(in_stack_ffffffffffffede0,in_stack_ffffffffffffedd8);
    return;
  }
  ch_00 = (CHAR_DATA *)get_eq_char(in_RDI,0x11);
  if (ch_00 == (CHAR_DATA *)0x0) {
    send_to_char(in_stack_ffffffffffffede0,(CHAR_DATA *)0x0);
    return;
  }
  if (*(short *)&ch_00->carrying != 3) {
    send_to_char(in_stack_ffffffffffffede0,ch_00);
    return;
  }
  argument_00 = (OBJ_DATA *)0x0;
  if (local_1218 == '\0') {
    if (in_RDI->fighting == (CHAR_DATA *)0x0) {
      send_to_char(in_stack_ffffffffffffede0,ch_00);
      return;
    }
    ch_01 = in_RDI->fighting;
  }
  else {
    ch_01 = get_char_room(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    argument_00 = get_obj_here(ch_00,(char *)argument_00);
    if ((ch_01 == (CHAR_DATA *)0x0) && (argument_00 == (OBJ_DATA *)0x0)) {
      send_to_char((char *)0x0,ch_00);
      return;
    }
  }
  bVar1 = check_entwine(in_RDI,1);
  if (bVar1) {
    send_to_char((char *)ch_01,ch_00);
    return;
  }
  WAIT_STATE(ch_01,(int)((ulong)ch_00 >> 0x20));
  if (0 < *(int *)((long)&ch_00->prompt + 4)) {
    if (ch_01 == (CHAR_DATA *)0x0) {
      act((char *)0x0,ch_00,argument_00,
          (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
      act((char *)ch_01,ch_00,argument_00,
          (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
    }
    else {
      act((char *)ch_01,ch_00,argument_00,
          (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
      act((char *)ch_01,ch_00,argument_00,
          (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
      act((char *)ch_01,ch_00,argument_00,
          (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
    }
    if (*(short *)&ch_00->short_descr <= in_RDI->level) {
      in_stack_ffffffffffffedcc = number_percent();
      iVar2 = get_skill(in_stack_ffffffffffffeed0,in_stack_ffffffffffffeecc);
      if (in_stack_ffffffffffffedcc < (iVar2 << 2) / 5 + 0x14) {
        bVar1 = check_deny_magic((CHAR_DATA *)
                                 CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8));
        if (!bVar1) {
          obj_cast_spell(in_stack_ffffffffffffee34,in_stack_ffffffffffffee30,
                         in_stack_ffffffffffffee28,in_stack_ffffffffffffee20,
                         in_stack_ffffffffffffee18);
        }
        check_improve(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
                      (bool)in_stack_ffffffffffffeeab,in_stack_ffffffffffffeea4);
        goto LAB_0057a8a1;
      }
    }
    act((char *)ch_01,ch_00,argument_00,
        (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
    act((char *)ch_01,ch_00,argument_00,
        (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
    check_improve(in_stack_ffffffffffffeeb0,in_stack_ffffffffffffeeac,
                  (bool)in_stack_ffffffffffffeeab,in_stack_ffffffffffffeea4);
  }
LAB_0057a8a1:
  iVar2 = *(int *)((long)&ch_00->prompt + 4) + -1;
  *(int *)((long)&ch_00->prompt + 4) = iVar2;
  if (iVar2 < 1) {
    act((char *)ch_01,ch_00,argument_00,
        (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
    act((char *)ch_01,ch_00,argument_00,
        (void *)CONCAT44(in_stack_ffffffffffffedcc,in_stack_ffffffffffffedc8),0);
    extract_obj(in_stack_ffffffffffffedf0);
  }
  return;
}

Assistant:

void do_zap(CHAR_DATA *ch, char *argument)
{
	char arg[MAX_INPUT_LENGTH];
	CHAR_DATA *victim;
	OBJ_DATA *wand;
	OBJ_DATA *obj;

	one_argument(argument, arg);

	if (arg[0] == '\0' && ch->fighting == nullptr)
	{
		send_to_char("Zap whom or what?\n\r", ch);
		return;
	}

	wand = get_eq_char(ch, WEAR_HOLD);

	if (wand == nullptr)
	{
		send_to_char("You hold nothing in your hand.\n\r", ch);
		return;
	}

	if (wand->item_type != ITEM_WAND)
	{
		send_to_char("You can zap only with a wand.\n\r", ch);
		return;
	}

	obj = nullptr;

	if (arg[0] == '\0')
	{
		if (ch->fighting != nullptr)
		{
			victim = ch->fighting;
		}
		else
		{
			send_to_char("Zap whom or what?\n\r", ch);
			return;
		}
	}
	else
	{
		victim = get_char_room(ch, arg);
		obj = get_obj_here(ch, arg);

		if (victim == nullptr && obj == nullptr)
		{
			send_to_char("You can't find it.\n\r", ch);
			return;
		}
	}

	if (check_entwine(ch, 1))
	{
		send_to_char("You are too entwined to do that.\n\r", ch);
		return;
	}

	WAIT_STATE(ch, 2 * PULSE_VIOLENCE);

	if (wand->value[2] > 0)
	{
		if (victim != nullptr)
		{
			act("$n zaps $N with $p.", ch, wand, victim, TO_NOTVICT);
			act("You zap $N with $p.", ch, wand, victim, TO_CHAR);
			act("$n zaps you with $p.", ch, wand, victim, TO_VICT);
		}
		else
		{
			act("$n zaps $P with $p.", ch, wand, obj, TO_ROOM);
			act("You zap $P with $p.", ch, wand, obj, TO_CHAR);
		}

		if (ch->level < wand->level || number_percent() >= 20 + get_skill(ch, gsn_wands) * 4 / 5)
		{
			act("Your efforts with $p produce only smoke and sparks.", ch, wand, nullptr, TO_CHAR);
			act("$n's efforts with $p produce only smoke and sparks.", ch, wand, nullptr, TO_ROOM);
			check_improve(ch, gsn_wands, false, 2);
		}
		else
		{
			if (!check_deny_magic(ch))
				obj_cast_spell(wand->value[3], wand->value[0], ch, victim, obj);

			check_improve(ch, gsn_wands, true, 2);
		}
	}

	if (--wand->value[2] <= 0)
	{
		act("$n's $p explodes into fragments.", ch, wand, nullptr, TO_ROOM);
		act("Your $p explodes into fragments.", ch, wand, nullptr, TO_CHAR);
		extract_obj(wand);
	}
}